

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O3

tuple<int,_int,_int>
libtorrent::merkle_find_known_subtree
          (span<const_libtorrent::digest32<256L>_> tree,int block_index,int num_valid_leafs)

{
  bool bVar1;
  uint uVar2;
  uint uVar4;
  uint uVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  _Head_base<0UL,_int,_false> _Var6;
  int in_register_00000014;
  int iVar7;
  _Tuple_impl<1UL,_int,_int> _Var8;
  int in_R8D;
  digest32<256L> *this;
  ulong uVar9;
  int i;
  uint uVar10;
  tuple<int,_int,_int> tVar11;
  int iVar3;
  
  _Var8 = (_Tuple_impl<1UL,_int,_int>)tree.m_ptr;
  iVar3 = (int)((ulong)(CONCAT44(in_register_00000014,block_index) -
                       ((long)in_register_00000014 >> 0x1f)) >> 1);
  uVar2 = iVar3 + num_valid_leafs;
  iVar7 = (-(uint)((uVar2 & 1) == 0) | 1) + uVar2;
  uVar2 = 1;
  uVar10 = num_valid_leafs;
  do {
    uVar4 = -uVar2;
    if ((uVar10 & 1) == 0) {
      uVar4 = uVar2;
    }
    uVar5 = in_R8D - (uVar4 + num_valid_leafs);
    if ((int)uVar2 <= (int)uVar5) {
      uVar5 = uVar2;
    }
    if (0 < (int)uVar5) {
      uVar9 = (ulong)uVar5;
      this = (digest32<256L> *)((long)(int)(uVar4 + num_valid_leafs + iVar3) * 0x20 + tree.m_len);
      do {
        bVar1 = digest32<256L>::is_all_zeros(this);
        _Var6._M_head_impl = extraout_EDX;
        if (bVar1) goto LAB_00223688;
        this = this + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    num_valid_leafs = num_valid_leafs - (-(uVar10 & 1) & uVar2);
    uVar2 = uVar2 * 2;
    iVar7 = (iVar7 - (iVar7 + -1 >> 0x1f)) + -1 >> 1;
    bVar1 = digest32<256L>::is_all_zeros((digest32<256L> *)((long)iVar7 * 0x20 + tree.m_len));
    uVar10 = (int)uVar10 >> 1;
    _Var6._M_head_impl = extraout_EDX_00;
  } while (bVar1);
LAB_00223688:
  *(int *)_Var8 = iVar7;
  *(uint *)((long)_Var8 + 4) = uVar2;
  *(int *)((long)_Var8 + 8) = num_valid_leafs;
  tVar11.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       _Var6._M_head_impl;
  tVar11.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> = _Var8;
  return (tuple<int,_int,_int>)tVar11.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> merkle_find_known_subtree(span<sha256_hash const> const tree
		, int const block_index, int const num_valid_leafs)
	{
		// find the largest block of leafs from a single subtree we know the hashes of
		int leafs_start = block_index;
		int leafs_size = 1;
		int const first_leaf = int(tree.size() / 2);
		int root_index = merkle_get_sibling(first_leaf + block_index);
		for (int i = block_index;; i >>= 1)
		{
			int const first_check_index = leafs_start + ((i & 1) ? -leafs_size : leafs_size);
			for (int j = 0; j < std::min(leafs_size, num_valid_leafs - first_check_index); ++j)
			{
				if (tree[first_leaf + first_check_index + j].is_all_zeros())
					return std::make_tuple(leafs_start, leafs_size, root_index);
			}
			if (i & 1) leafs_start -= leafs_size;
			leafs_size *= 2;
			root_index = merkle_get_parent(root_index);
			// if an inner node is known then its parent must be known too
			// so if the root is known the next sibling subtree should already
			// be computed if all of its leafs have valid hashes
			if (!tree[root_index].is_all_zeros()) break;
			TORRENT_ASSERT(root_index != 0);
			TORRENT_ASSERT(leafs_start >= 0);
			TORRENT_ASSERT(leafs_size <= merkle_num_leafs(num_valid_leafs));
		}

		TORRENT_ASSERT(leafs_start >= 0);
		TORRENT_ASSERT(leafs_start < merkle_num_leafs(num_valid_leafs));
		TORRENT_ASSERT(leafs_start + leafs_size > block_index);

		return std::make_tuple(leafs_start, leafs_size, root_index);
	}